

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::connection::async_prepare_request(connection *this,context *context,ehandler *h)

{
  char cVar1;
  int iVar2;
  level_type lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  error_code e;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_b8;
  intrusive_ptr<booster::callable<void_()>_> local_b0;
  intrusive_ptr<booster::callable<void_()>_> local_a8;
  context *local_a0;
  anon_enum_32 local_94;
  __shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  int local_80;
  long *local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_50 [6];
  
  local_80 = 0;
  local_a0 = context;
  local_78 = (long *)std::_V2::system_category();
  iVar2 = (*this->_vptr_connection[0xe])(this);
  booster::aio::basic_io_device::set_non_blocking(SUB41(iVar2,0),(error_code *)0x1);
  if (local_80 == 0) {
    std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection,void>
              (local_90,(__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
    mfunc_to_event_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
              ((offset_in_connection_to_subr)&local_b8,
               (shared_ptr<cppcms::impl::cgi::connection> *)on_headers_read,(context **)0x0,
               (callback<void_(cppcms::http::context::completion_type)> *)local_90);
    local_50[0].p_ = local_b8.p_;
    if (local_b8.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
      booster::atomic_counter::inc();
    }
    (*this->_vptr_connection[0xf])(this,local_50);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (local_50);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_b8);
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
  }
  else {
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)local_50,warning,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cgi_api.cpp"
                 ,0xba);
      poVar4 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Failed to set nonblocking mode in socket ",0x29);
      (**(code **)(*local_78 + 0x20))(&local_70,local_78,local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
      if (cVar1 != '\0') {
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        booster::log::message::~message((message *)local_50);
      }
    }
    iVar2 = (*this->_vptr_connection[0xc])(this);
    local_94 = operation_aborted;
    func_to_handler<booster::callback<void(cppcms::http::context::completion_type)>,cppcms::http::context::completion_type>
              ((impl *)&local_a8,h,&local_94);
    local_b0.p_ = local_a8.p_;
    if (local_a8.p_ != (callable<void_()> *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar2));
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_b0);
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_a8);
  }
  return;
}

Assistant:

void connection::async_prepare_request(	http::context *context,
					ehandler const &h)
{
	booster::system::error_code e;
	socket().set_non_blocking(true,e);
	if(e) {
		BOOSTER_WARNING("cppcms") << "Failed to set nonblocking mode in socket " << e.message();
		get_io_service().post(func_to_handler(h,http::context::operation_aborted));
		return;
	}
	async_read_headers(mfunc_to_event_handler(&connection::on_headers_read,self(),context,h));
}